

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputGetString
               (HelicsInput inp,char *outputString,int maxStringLen,int *actualLength,
               HelicsError *err)

{
  bool bVar1;
  int iVar2;
  InputObject *pIVar3;
  Input *in_RCX;
  char *in_R8;
  int length;
  InputObject *inpObj;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  if (in_RCX != (Input *)0x0) {
    *(undefined4 *)&(in_RCX->super_Interface)._vptr_Interface = 0;
  }
  pIVar3 = anon_unknown.dwarf_5d1c2::verifyInput
                     ((HelicsInput)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (HelicsError *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (((pIVar3 != (InputObject *)0x0) &&
      (bVar1 = checkOutputArgString
                         ((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,
                          (HelicsError *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)), bVar1)) &&
     (iVar2 = helics::Input::getValue(in_RCX,in_R8,(int)((ulong)pIVar3 >> 0x20)),
     in_RCX != (Input *)0x0)) {
    *(int *)&(in_RCX->super_Interface)._vptr_Interface = iVar2;
  }
  return;
}

Assistant:

void helicsInputGetString(HelicsInput inp, char* outputString, int maxStringLen, int* actualLength, HelicsError* err)
{
    if (actualLength != nullptr) {  // for initialization
        *actualLength = 0;
    }
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }

    if (!checkOutputArgString(outputString, maxStringLen, err)) {
        return;
    }
    try {
        const int length = inpObj->inputPtr->getValue(outputString, maxStringLen);
        if (actualLength != nullptr) {  // for initialization
            *actualLength = length;
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}